

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O3

void __thiscall slack::_detail::Session::~Session(Session *this)

{
  pointer pcVar1;
  
  curl_easy_cleanup(this->curl_);
  curl_global_cleanup();
  pcVar1 = (this->token_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->token_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->proxy_url_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->proxy_url_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->url_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->url_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Session() { curl_easy_cleanup(curl_); curl_global_cleanup(); }